

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O0

void __thiscall
icu_63::Normalizer2DataBuilder::writeDataFile
          (Normalizer2DataBuilder *this,char *filename,bool writeRemoved)

{
  bool bVar1;
  UBool UVar2;
  bool bVar3;
  FILE *__stream;
  uint local_114;
  UnicodeString *pUStack_110;
  MappingType type;
  UnicodeString *mapping;
  Norm *norm;
  UChar32 c_1;
  MappingType prevType;
  UnicodeString *prevMapping;
  UnicodeSetIterator mIter;
  uint8_t local_99;
  int local_98;
  uint8_t cc;
  UChar32 c;
  bool didWrite;
  bool done;
  int iStack_8c;
  uint8_t prevCC;
  UChar32 end;
  UChar32 start;
  UnicodeSetIterator ccIter;
  char uv [20];
  FILE *f;
  bool writeRemoved_local;
  char *filename_local;
  Normalizer2DataBuilder *this_local;
  
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"gennorm2/writeDataFile() error: unable to create the output file %s\n",filename
           );
    exit(4);
  }
  if ((((this->unicodeVersion[0] != '\0') || (this->unicodeVersion[1] != '\0')) ||
      (this->unicodeVersion[2] != '\0')) || (this->unicodeVersion[3] != '\0')) {
    u_versionToString_63(this->unicodeVersion,(char *)&ccIter.cpString);
    fprintf(__stream,"* Unicode %s\n\n",&ccIter.cpString);
  }
  UnicodeSetIterator::UnicodeSetIterator((UnicodeSetIterator *)&end,(UnicodeSet *)this);
  iStack_8c = -1;
  c = -1;
  cc = '\0';
  bVar1 = false;
  bVar3 = false;
  do {
    UVar2 = UnicodeSetIterator::next((UnicodeSetIterator *)&end);
    if ((UVar2 == '\0') ||
       (UVar2 = UnicodeSetIterator::isString((UnicodeSetIterator *)&end), UVar2 != '\0')) {
      local_98 = 0x110000;
      local_99 = '\0';
      bVar1 = true;
    }
    else {
      local_98 = UnicodeSetIterator::getCodepoint((UnicodeSetIterator *)&end);
      local_99 = Norms::getCC(&this->norms,local_98);
    }
    if ((local_99 != cc) || (local_98 != c + 1)) {
      if (cc != '\0') {
        if (iStack_8c == c) {
          fprintf(__stream,"%04lX:%d\n",(long)iStack_8c,(ulong)cc);
        }
        else {
          fprintf(__stream,"%04lX..%04lX:%d\n",(long)iStack_8c,(long)c,(ulong)cc);
        }
        bVar3 = true;
      }
      iStack_8c = local_98;
      cc = local_99;
    }
    c = local_98;
  } while (!bVar1);
  if (bVar3) {
    fputs("\n",__stream);
  }
  UnicodeSetIterator::UnicodeSetIterator
            ((UnicodeSetIterator *)&prevMapping,&(this->norms).mappingSet);
  iStack_8c = -1;
  c = -1;
  _c_1 = (UnicodeString *)0x0;
  norm._4_4_ = 0;
  bVar1 = false;
  do {
    UVar2 = UnicodeSetIterator::next((UnicodeSetIterator *)&prevMapping);
    if ((UVar2 == '\0') ||
       (UVar2 = UnicodeSetIterator::isString((UnicodeSetIterator *)&prevMapping), UVar2 != '\0')) {
      norm._0_4_ = 0x110000;
      mapping = (UnicodeString *)0x0;
      bVar1 = true;
    }
    else {
      norm._0_4_ = UnicodeSetIterator::getCodepoint((UnicodeSetIterator *)&prevMapping);
      mapping = (UnicodeString *)Norms::getNorm(&this->norms,(UChar32)norm);
    }
    if (mapping == (UnicodeString *)0x0) {
      pUStack_110 = (UnicodeString *)0x0;
      local_114 = 0;
    }
    else {
      local_114 = *(uint *)((long)&mapping->fUnion + 0x10);
      if (local_114 == 0) {
        pUStack_110 = (UnicodeString *)0x0;
      }
      else {
        pUStack_110 = (UnicodeString *)(mapping->super_Replaceable).super_UObject._vptr_UObject;
      }
    }
    if (((local_114 != norm._4_4_) ||
        (bVar3 = anon_unknown_1::equalStrings(pUStack_110,_c_1), !bVar3)) ||
       ((UChar32)norm != c + 1)) {
      if (writeRemoved) {
        if (norm._4_4_ != 0) {
LAB_00205287:
          if (iStack_8c == c) {
            fprintf(__stream,"%04lX%c",(long)iStack_8c,
                    (ulong)(uint)(int)(char)(anonymous_namespace)::typeChars[norm._4_4_]);
          }
          else {
            fprintf(__stream,"%04lX..%04lX%c",(long)iStack_8c,(long)c,
                    (ulong)(uint)(int)(char)(anonymous_namespace)::typeChars[norm._4_4_]);
          }
          anon_unknown_1::writeMapping((FILE *)__stream,_c_1);
        }
      }
      else if (1 < (int)norm._4_4_) goto LAB_00205287;
      iStack_8c = (UChar32)norm;
      _c_1 = pUStack_110;
      norm._4_4_ = local_114;
    }
    c = (UChar32)norm;
    if (bVar1) {
      fclose(__stream);
      UnicodeSetIterator::~UnicodeSetIterator((UnicodeSetIterator *)&prevMapping);
      UnicodeSetIterator::~UnicodeSetIterator((UnicodeSetIterator *)&end);
      return;
    }
  } while( true );
}

Assistant:

void
Normalizer2DataBuilder::writeDataFile(const char *filename, bool writeRemoved) const {
    // Do not processData() before writing the input-syntax data file.
    FILE *f = fopen(filename, "w");
    if(f == nullptr) {
        fprintf(stderr, "gennorm2/writeDataFile() error: unable to create the output file %s\n",
                filename);
        exit(U_FILE_ACCESS_ERROR);
        return;
    }

    if(unicodeVersion[0] != 0 || unicodeVersion[1] != 0 ||
            unicodeVersion[2] != 0 || unicodeVersion[3] != 0) {
        char uv[U_MAX_VERSION_STRING_LENGTH];
        u_versionToString(unicodeVersion, uv);
        fprintf(f, "* Unicode %s\n\n", uv);
    }

    UnicodeSetIterator ccIter(norms.ccSet);
    UChar32 start = U_SENTINEL;
    UChar32 end = U_SENTINEL;
    uint8_t prevCC = 0;
    bool done = false;
    bool didWrite = false;
    do {
        UChar32 c;
        uint8_t cc;
        if(ccIter.next() && !ccIter.isString()) {
            c = ccIter.getCodepoint();
            cc = norms.getCC(c);
        } else {
            c = 0x110000;
            cc = 0;
            done = true;
        }
        if(cc == prevCC && c == (end + 1)) {
            end = c;
        } else {
            if(prevCC != 0) {
                if(start == end) {
                    fprintf(f, "%04lX:%d\n", (long)start, (int)prevCC);
                } else {
                    fprintf(f, "%04lX..%04lX:%d\n", (long)start, (long)end, (int)prevCC);
                }
                didWrite = true;
            }
            start = end = c;
            prevCC = cc;
        }
    } while(!done);
    if(didWrite) {
        fputs("\n", f);
    }

    UnicodeSetIterator mIter(norms.mappingSet);
    start = U_SENTINEL;
    end = U_SENTINEL;
    const UnicodeString *prevMapping = nullptr;
    Norm::MappingType prevType = Norm::NONE;
    done = false;
    do {
        UChar32 c;
        const Norm *norm;
        if(mIter.next() && !mIter.isString()) {
            c = mIter.getCodepoint();
            norm = norms.getNorm(c);
        } else {
            c = 0x110000;
            norm = nullptr;
            done = true;
        }
        const UnicodeString *mapping;
        Norm::MappingType type;
        if(norm == nullptr) {
            mapping = nullptr;
            type = Norm::NONE;
        } else {
            type = norm->mappingType;
            if(type == Norm::NONE) {
                mapping = nullptr;
            } else {
                mapping = norm->mapping;
            }
        }
        if(type == prevType && equalStrings(mapping, prevMapping) && c == (end + 1)) {
            end = c;
        } else {
            if(writeRemoved ? prevType != Norm::NONE : prevType > Norm::REMOVED) {
                if(start == end) {
                    fprintf(f, "%04lX%c", (long)start, typeChars[prevType]);
                } else {
                    fprintf(f, "%04lX..%04lX%c", (long)start, (long)end, typeChars[prevType]);
                }
                writeMapping(f, prevMapping);
            }
            start = end = c;
            prevMapping = mapping;
            prevType = type;
        }
    } while(!done);

    fclose(f);
}